

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::ErrorTest_ErrorToString_NonOkErrorToString_Test::TestBody
          (ErrorTest_ErrorToString_NonOkErrorToString_Test *this)

{
  bool bVar1;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  format_args args_11;
  format_args args_12;
  format_args args_13;
  format_args args_14;
  format_args args_15;
  format_args args_16;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  string_view fmt_11;
  string_view fmt_12;
  string_view fmt_13;
  string_view fmt_14;
  string_view fmt_15;
  string_view fmt_16;
  AssertHelper local_1840;
  Message local_1838;
  uint local_1830;
  anon_class_1_0_00000001 local_182a;
  v10 local_1829;
  v10 *local_1828;
  size_t local_1820;
  string local_1818;
  Error local_17f8;
  string local_17d0;
  unsigned_long local_17b0;
  undefined1 local_17a8 [8];
  AssertionResult gtest_ar_17;
  Message local_1790;
  uint local_1788;
  anon_class_1_0_00000001 local_1782;
  v10 local_1781;
  v10 *local_1780;
  size_t local_1778;
  string local_1770;
  Error local_1750;
  string local_1728;
  unsigned_long local_1708;
  undefined1 local_1700 [8];
  AssertionResult gtest_ar_16;
  Message local_16e8;
  uint local_16e0;
  anon_class_1_0_00000001 local_16da;
  v10 local_16d9;
  v10 *local_16d8;
  size_t local_16d0;
  string local_16c8;
  Error local_16a8;
  string local_1680;
  unsigned_long local_1660;
  undefined1 local_1658 [8];
  AssertionResult gtest_ar_15;
  Message local_1640;
  uint local_1638;
  anon_class_1_0_00000001 local_1632;
  v10 local_1631;
  v10 *local_1630;
  size_t local_1628;
  string local_1620;
  Error local_1600;
  string local_15d8;
  unsigned_long local_15b8;
  undefined1 local_15b0 [8];
  AssertionResult gtest_ar_14;
  Message local_1598;
  uint local_1590;
  anon_class_1_0_00000001 local_158a;
  v10 local_1589;
  v10 *local_1588;
  size_t local_1580;
  string local_1578;
  Error local_1558;
  string local_1530;
  unsigned_long local_1510;
  undefined1 local_1508 [8];
  AssertionResult gtest_ar_13;
  Message local_14f0;
  uint local_14e8;
  anon_class_1_0_00000001 local_14e2;
  v10 local_14e1;
  v10 *local_14e0;
  size_t local_14d8;
  string local_14d0;
  Error local_14b0;
  string local_1488;
  unsigned_long local_1468;
  undefined1 local_1460 [8];
  AssertionResult gtest_ar_12;
  Message local_1448;
  uint local_1440;
  anon_class_1_0_00000001 local_143a;
  v10 local_1439;
  v10 *local_1438;
  size_t local_1430;
  string local_1428;
  Error local_1408;
  string local_13e0;
  unsigned_long local_13c0;
  undefined1 local_13b8 [8];
  AssertionResult gtest_ar_11;
  Message local_13a0;
  uint local_1398;
  anon_class_1_0_00000001 local_1392;
  v10 local_1391;
  v10 *local_1390;
  size_t local_1388;
  string local_1380;
  Error local_1360;
  string local_1338;
  unsigned_long local_1318;
  undefined1 local_1310 [8];
  AssertionResult gtest_ar_10;
  Message local_12f8;
  uint local_12f0;
  anon_class_1_0_00000001 local_12ea;
  v10 local_12e9;
  v10 *local_12e8;
  size_t local_12e0;
  string local_12d8;
  Error local_12b8;
  string local_1290;
  unsigned_long local_1270;
  undefined1 local_1268 [8];
  AssertionResult gtest_ar_9;
  Message local_1250;
  uint local_1248;
  anon_class_1_0_00000001 local_1242;
  v10 local_1241;
  v10 *local_1240;
  size_t local_1238;
  string local_1230;
  Error local_1210;
  string local_11e8;
  unsigned_long local_11c8;
  undefined1 local_11c0 [8];
  AssertionResult gtest_ar_8;
  Message local_11a8;
  uint local_11a0;
  anon_class_1_0_00000001 local_119a;
  v10 local_1199;
  v10 *local_1198;
  size_t local_1190;
  string local_1188;
  Error local_1168;
  string local_1140;
  unsigned_long local_1120;
  undefined1 local_1118 [8];
  AssertionResult gtest_ar_7;
  Message local_1100;
  uint local_10f8;
  anon_class_1_0_00000001 local_10f2;
  v10 local_10f1;
  v10 *local_10f0;
  size_t local_10e8;
  string local_10e0;
  Error local_10c0;
  string local_1098;
  unsigned_long local_1078;
  undefined1 local_1070 [8];
  AssertionResult gtest_ar_6;
  Message local_1058;
  uint local_1050;
  anon_class_1_0_00000001 local_104a;
  v10 local_1049;
  v10 *local_1048;
  size_t local_1040;
  string local_1038;
  Error local_1018;
  string local_ff0;
  unsigned_long local_fd0;
  undefined1 local_fc8 [8];
  AssertionResult gtest_ar_5;
  Message local_fb0;
  uint local_fa8;
  anon_class_1_0_00000001 local_fa2;
  v10 local_fa1;
  v10 *local_fa0;
  size_t local_f98;
  string local_f90;
  Error local_f70;
  string local_f48;
  unsigned_long local_f28;
  undefined1 local_f20 [8];
  AssertionResult gtest_ar_4;
  Message local_f08;
  uint local_f00;
  anon_class_1_0_00000001 local_efa;
  v10 local_ef9;
  v10 *local_ef8;
  size_t local_ef0;
  string local_ee8;
  Error local_ec8;
  string local_ea0;
  unsigned_long local_e80;
  undefined1 local_e78 [8];
  AssertionResult gtest_ar_3;
  Message local_e60;
  uint local_e58;
  anon_class_1_0_00000001 local_e52;
  v10 local_e51;
  v10 *local_e50;
  size_t local_e48;
  string local_e40;
  Error local_e20;
  string local_df8;
  unsigned_long local_dd8;
  undefined1 local_dd0 [8];
  AssertionResult gtest_ar_2;
  Message local_db8;
  uint local_db0;
  anon_class_1_0_00000001 local_daa;
  v10 local_da9;
  v10 *local_da8;
  size_t local_da0;
  string local_d98;
  Error local_d78;
  string local_d50;
  unsigned_long local_d30;
  undefined1 local_d28 [8];
  AssertionResult gtest_ar_1;
  Message local_d10;
  uint local_d08 [5];
  anon_class_1_0_00000001 local_cf2;
  v10 local_cf1;
  v10 *local_cf0;
  size_t local_ce8;
  string local_ce0;
  Error local_cc0;
  string local_c98;
  unsigned_long local_c78;
  undefined1 local_c70 [8];
  AssertionResult gtest_ar;
  ErrorTest_ErrorToString_NonOkErrorToString_Test *this_local;
  undefined1 local_c40 [16];
  v10 *local_c30;
  ulong local_c28;
  v10 *local_c20;
  size_t sStack_c18;
  string *local_c10;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_c08 [3];
  undefined1 local_bf0 [16];
  v10 *local_be0;
  ulong local_bd8;
  v10 *local_bd0;
  size_t sStack_bc8;
  string *local_bc0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_bb8 [3];
  undefined1 local_ba0 [16];
  v10 *local_b90;
  ulong local_b88;
  v10 *local_b80;
  size_t sStack_b78;
  string *local_b70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_b68 [3];
  undefined1 local_b50 [16];
  v10 *local_b40;
  ulong local_b38;
  v10 *local_b30;
  size_t sStack_b28;
  string *local_b20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_b18 [3];
  undefined1 local_b00 [16];
  v10 *local_af0;
  ulong local_ae8;
  v10 *local_ae0;
  size_t sStack_ad8;
  string *local_ad0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_ac8 [3];
  undefined1 local_ab0 [16];
  v10 *local_aa0;
  ulong local_a98;
  v10 *local_a90;
  size_t sStack_a88;
  string *local_a80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a78 [3];
  undefined1 local_a60 [16];
  v10 *local_a50;
  ulong local_a48;
  v10 *local_a40;
  size_t sStack_a38;
  string *local_a30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a28 [3];
  undefined1 local_a10 [16];
  v10 *local_a00;
  ulong local_9f8;
  v10 *local_9f0;
  size_t sStack_9e8;
  string *local_9e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_9d8 [3];
  undefined1 local_9c0 [16];
  v10 *local_9b0;
  ulong local_9a8;
  v10 *local_9a0;
  size_t sStack_998;
  string *local_990;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_988 [3];
  undefined1 local_970 [16];
  v10 *local_960;
  ulong local_958;
  v10 *local_950;
  size_t sStack_948;
  string *local_940;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_938 [3];
  undefined1 local_920 [16];
  v10 *local_910;
  ulong local_908;
  v10 *local_900;
  size_t sStack_8f8;
  string *local_8f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_8e8 [3];
  undefined1 local_8d0 [16];
  v10 *local_8c0;
  ulong local_8b8;
  v10 *local_8b0;
  size_t sStack_8a8;
  string *local_8a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_898 [3];
  undefined1 local_880 [16];
  v10 *local_870;
  ulong local_868;
  v10 *local_860;
  size_t sStack_858;
  string *local_850;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_848 [3];
  undefined1 local_830 [16];
  v10 *local_820;
  ulong local_818;
  v10 *local_810;
  size_t sStack_808;
  string *local_800;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_7f8 [3];
  undefined1 local_7e0 [16];
  v10 *local_7d0;
  ulong local_7c8;
  v10 *local_7c0;
  size_t sStack_7b8;
  string *local_7b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_7a8 [3];
  undefined1 local_790 [16];
  v10 *local_780;
  ulong local_778;
  v10 *local_770;
  size_t sStack_768;
  string *local_760;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_758 [3];
  undefined1 local_740 [16];
  v10 *local_730;
  ulong local_728;
  v10 *local_720;
  size_t sStack_718;
  string *local_710;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_708 [2];
  undefined1 local_6f8 [16];
  v10 *local_6e8;
  ulong local_6e0;
  v10 *local_6d8;
  size_t sStack_6d0;
  string *local_6c8;
  v10 *local_6c0;
  v10 **local_6b8;
  v10 *local_6b0;
  v10 **local_6a8;
  v10 *local_6a0;
  v10 **local_698;
  v10 *local_690;
  v10 **local_688;
  v10 *local_680;
  v10 **local_678;
  v10 *local_670;
  v10 **local_668;
  v10 *local_660;
  v10 **local_658;
  v10 *local_650;
  v10 **local_648;
  v10 *local_640;
  v10 **local_638;
  v10 *local_630;
  v10 **local_628;
  v10 *local_620;
  v10 **local_618;
  v10 *local_610;
  v10 **local_608;
  v10 *local_600;
  v10 **local_5f8;
  v10 *local_5f0;
  v10 **local_5e8;
  v10 *local_5e0;
  v10 **local_5d8;
  v10 *local_5d0;
  v10 **local_5c8;
  v10 *local_5c0;
  v10 **local_5b8;
  v10 *local_5b0;
  v10 **local_5a8;
  v10 **local_5a0;
  v10 *local_598;
  size_t sStack_590;
  v10 **local_580;
  v10 *local_578;
  size_t sStack_570;
  v10 **local_560;
  v10 *local_558;
  size_t sStack_550;
  v10 **local_540;
  v10 *local_538;
  size_t sStack_530;
  v10 **local_520;
  v10 *local_518;
  size_t sStack_510;
  v10 **local_500;
  v10 *local_4f8;
  size_t sStack_4f0;
  v10 **local_4e0;
  v10 *local_4d8;
  size_t sStack_4d0;
  v10 **local_4c0;
  v10 *local_4b8;
  size_t sStack_4b0;
  v10 **local_4a0;
  v10 *local_498;
  size_t sStack_490;
  v10 **local_480;
  v10 *local_478;
  size_t sStack_470;
  v10 **local_460;
  v10 *local_458;
  size_t sStack_450;
  v10 **local_440;
  v10 *local_438;
  size_t sStack_430;
  v10 **local_420;
  v10 *local_418;
  size_t sStack_410;
  v10 **local_400;
  v10 *local_3f8;
  size_t sStack_3f0;
  v10 **local_3e0;
  v10 *local_3d8;
  size_t sStack_3d0;
  v10 **local_3c0;
  v10 *local_3b8;
  size_t sStack_3b0;
  v10 **local_3a0;
  v10 *local_398;
  size_t sStack_390;
  v10 **local_380;
  v10 *local_378;
  size_t sStack_370;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_368;
  undefined1 *local_360;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_358;
  undefined1 *local_350;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_348;
  undefined1 *local_340;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_338;
  undefined1 *local_330;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_328;
  undefined1 *local_320;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_318;
  undefined1 *local_310;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_308;
  undefined1 *local_300;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_2f8;
  undefined1 *local_2f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_2e8;
  undefined1 *local_2e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_2d8;
  undefined1 *local_2d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_2c8;
  undefined1 *local_2c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_2b8;
  undefined1 *local_2b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_2a8;
  undefined1 *local_2a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_298;
  undefined1 *local_290;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_288;
  undefined1 *local_280;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_278;
  undefined1 *local_270;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_268;
  undefined1 *local_260;
  ErrorTest_ErrorToString_NonOkErrorToString_Test **local_258;
  undefined1 *local_250;
  ErrorTest_ErrorToString_NonOkErrorToString_Test **local_248;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_240;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_238;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_230;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_228;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_220;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_218;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_210;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_208;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_200;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1c0;
  ErrorTest_ErrorToString_NonOkErrorToString_Test **local_1b8;
  undefined8 local_1b0;
  undefined1 *local_1a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1a0;
  undefined8 local_198;
  undefined1 *local_190;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_188;
  undefined8 local_180;
  undefined1 *local_178;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_170;
  undefined8 local_168;
  undefined1 *local_160;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_158;
  undefined8 local_150;
  undefined1 *local_148;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_140;
  undefined8 local_138;
  undefined1 *local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_128;
  undefined8 local_120;
  undefined1 *local_118;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_110;
  undefined8 local_108;
  undefined1 *local_100;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_f8;
  undefined8 local_f0;
  undefined1 *local_e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_e0;
  undefined8 local_d8;
  undefined1 *local_d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_c8;
  undefined8 local_c0;
  undefined1 *local_b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b0;
  undefined8 local_a8;
  undefined1 *local_a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_98;
  undefined8 local_90;
  undefined1 *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_80;
  undefined8 local_78;
  undefined1 *local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_50;
  undefined8 local_48;
  undefined1 *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  TestBody::anon_class_1_0_00000001::operator()(&local_cf2);
  local_6b8 = &local_cf0;
  local_6c0 = &local_cf1;
  bVar3 = ::fmt::v10::operator()(local_6c0);
  local_ce8 = bVar3.size_;
  local_cf0 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_6d8 = local_cf0;
  sStack_6d0 = local_ce8;
  local_5a0 = &local_6d8;
  local_6e8 = local_cf0;
  local_6e0 = local_ce8;
  local_6c8 = &local_ce0;
  local_598 = local_6e8;
  sStack_590 = local_6e0;
  local_708[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_360 = local_6f8;
  local_368 = local_708;
  local_18 = 0;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_368;
  fmt.size_ = 0;
  fmt.data_ = (char *)local_6e0;
  local_1c0 = local_368;
  local_20 = local_368;
  local_10 = local_360;
  ::fmt::v10::vformat_abi_cxx11_(&local_ce0,local_6e8,fmt,args);
  Error::Error(&local_cc0,kCancelled,&local_ce0);
  Error::ToString_abi_cxx11_(&local_c98,&local_cc0);
  local_c78 = std::__cxx11::string::find((char *)&local_c98,0x335081);
  local_d08[0] = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_c70,
             "(Error { ErrorCode::kCancelled, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"CANCELLED\"))"
             ,"0U",&local_c78,local_d08);
  std::__cxx11::string::~string((string *)&local_c98);
  Error::~Error(&local_cc0);
  std::__cxx11::string::~string((string *)&local_ce0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c70);
  if (!bVar1) {
    testing::Message::Message(&local_d10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c70);
  TestBody::anon_class_1_0_00000001::operator()(&local_daa);
  local_6a8 = &local_da8;
  local_6b0 = &local_da9;
  bVar3 = ::fmt::v10::operator()(local_6b0);
  local_da0 = bVar3.size_;
  local_da8 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_720 = local_da8;
  sStack_718 = local_da0;
  local_580 = &local_720;
  local_730 = local_da8;
  local_728 = local_da0;
  local_710 = &local_d98;
  local_578 = local_730;
  sStack_570 = local_728;
  local_758[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_350 = local_740;
  local_358 = local_758;
  local_30 = 0;
  args_00.field_1.values_ = in_R9.values_;
  args_00.desc_ = (unsigned_long_long)local_358;
  fmt_00.size_ = 0;
  fmt_00.data_ = (char *)local_728;
  local_1c8 = local_358;
  local_38 = local_358;
  local_28 = local_350;
  ::fmt::v10::vformat_abi_cxx11_(&local_d98,local_730,fmt_00,args_00);
  Error::Error(&local_d78,kInvalidArgs,&local_d98);
  Error::ToString_abi_cxx11_(&local_d50,&local_d78);
  local_d30 = std::__cxx11::string::find((char *)&local_d50,0x33521d);
  local_db0 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_d28,
             "(Error { ErrorCode::kInvalidArgs, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"INVALID_ARGS\"))"
             ,"0U",&local_d30,&local_db0);
  std::__cxx11::string::~string((string *)&local_d50);
  Error::~Error(&local_d78);
  std::__cxx11::string::~string((string *)&local_d98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d28);
  if (!bVar1) {
    testing::Message::Message(&local_db8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_db8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_db8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d28);
  TestBody::anon_class_1_0_00000001::operator()(&local_e52);
  local_698 = &local_e50;
  local_6a0 = &local_e51;
  bVar3 = ::fmt::v10::operator()(local_6a0);
  local_e48 = bVar3.size_;
  local_e50 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_770 = local_e50;
  sStack_768 = local_e48;
  local_560 = &local_770;
  local_780 = local_e50;
  local_778 = local_e48;
  local_760 = &local_e40;
  local_558 = local_780;
  sStack_550 = local_778;
  local_7a8[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_340 = local_790;
  local_348 = local_7a8;
  local_48 = 0;
  args_01.field_1.values_ = in_R9.values_;
  args_01.desc_ = (unsigned_long_long)local_348;
  fmt_01.size_ = 0;
  fmt_01.data_ = (char *)local_778;
  local_1d0 = local_348;
  local_50 = local_348;
  local_40 = local_340;
  ::fmt::v10::vformat_abi_cxx11_(&local_e40,local_780,fmt_01,args_01);
  Error::Error(&local_e20,kInvalidCommand,&local_e40);
  Error::ToString_abi_cxx11_(&local_df8,&local_e20);
  local_dd8 = std::__cxx11::string::find((char *)&local_df8,0x3353c2);
  local_e58 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_dd0,
             "(Error { ErrorCode::kInvalidCommand, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"INVALID_COMMAND\"))"
             ,"0U",&local_dd8,&local_e58);
  std::__cxx11::string::~string((string *)&local_df8);
  Error::~Error(&local_e20);
  std::__cxx11::string::~string((string *)&local_e40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd0);
  if (!bVar1) {
    testing::Message::Message(&local_e60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_dd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd0);
  TestBody::anon_class_1_0_00000001::operator()(&local_efa);
  local_688 = &local_ef8;
  local_690 = &local_ef9;
  bVar3 = ::fmt::v10::operator()(local_690);
  local_ef0 = bVar3.size_;
  local_ef8 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_7c0 = local_ef8;
  sStack_7b8 = local_ef0;
  local_540 = &local_7c0;
  local_7d0 = local_ef8;
  local_7c8 = local_ef0;
  local_7b0 = &local_ee8;
  local_538 = local_7d0;
  sStack_530 = local_7c8;
  local_7f8[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_330 = local_7e0;
  local_338 = local_7f8;
  local_60 = 0;
  args_02.field_1.values_ = in_R9.values_;
  args_02.desc_ = (unsigned_long_long)local_338;
  fmt_02.size_ = 0;
  fmt_02.data_ = (char *)local_7c8;
  local_1d8 = local_338;
  local_68 = local_338;
  local_58 = local_330;
  ::fmt::v10::vformat_abi_cxx11_(&local_ee8,local_7d0,fmt_02,args_02);
  Error::Error(&local_ec8,kTimeout,&local_ee8);
  Error::ToString_abi_cxx11_(&local_ea0,&local_ec8);
  local_e80 = std::__cxx11::string::find((char *)&local_ea0,0x34fcac);
  local_f00 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_e78,
             "(Error { ErrorCode::kTimeout, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"TIMEOUT\"))"
             ,"0U",&local_e80,&local_f00);
  std::__cxx11::string::~string((string *)&local_ea0);
  Error::~Error(&local_ec8);
  std::__cxx11::string::~string((string *)&local_ee8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e78);
  if (!bVar1) {
    testing::Message::Message(&local_f08);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_f08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_f08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e78);
  TestBody::anon_class_1_0_00000001::operator()(&local_fa2);
  local_678 = &local_fa0;
  local_680 = &local_fa1;
  bVar3 = ::fmt::v10::operator()(local_680);
  local_f98 = bVar3.size_;
  local_fa0 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_810 = local_fa0;
  sStack_808 = local_f98;
  local_520 = &local_810;
  local_820 = local_fa0;
  local_818 = local_f98;
  local_800 = &local_f90;
  local_518 = local_820;
  sStack_510 = local_818;
  local_848[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_320 = local_830;
  local_328 = local_848;
  local_78 = 0;
  args_03.field_1.values_ = in_R9.values_;
  args_03.desc_ = (unsigned_long_long)local_328;
  fmt_03.size_ = 0;
  fmt_03.data_ = (char *)local_818;
  local_1e0 = local_328;
  local_80 = local_328;
  local_70 = local_320;
  ::fmt::v10::vformat_abi_cxx11_(&local_f90,local_820,fmt_03,args_03);
  Error::Error(&local_f70,kNotFound,&local_f90);
  Error::ToString_abi_cxx11_(&local_f48,&local_f70);
  local_f28 = std::__cxx11::string::find((char *)&local_f48,0x3356e7);
  local_fa8 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_f20,
             "(Error { ErrorCode::kNotFound, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"NOT_FOUND\"))"
             ,"0U",&local_f28,&local_fa8);
  std::__cxx11::string::~string((string *)&local_f48);
  Error::~Error(&local_f70);
  std::__cxx11::string::~string((string *)&local_f90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f20);
  if (!bVar1) {
    testing::Message::Message(&local_fb0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_fb0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_fb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f20);
  TestBody::anon_class_1_0_00000001::operator()(&local_104a);
  local_668 = &local_1048;
  local_670 = &local_1049;
  bVar3 = ::fmt::v10::operator()(local_670);
  local_1040 = bVar3.size_;
  local_1048 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_860 = local_1048;
  sStack_858 = local_1040;
  local_500 = &local_860;
  local_870 = local_1048;
  local_868 = local_1040;
  local_850 = &local_1038;
  local_4f8 = local_870;
  sStack_4f0 = local_868;
  local_898[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_310 = local_880;
  local_318 = local_898;
  local_90 = 0;
  args_04.field_1.values_ = in_R9.values_;
  args_04.desc_ = (unsigned_long_long)local_318;
  fmt_04.size_ = 0;
  fmt_04.data_ = (char *)local_868;
  local_1e8 = local_318;
  local_98 = local_318;
  local_88 = local_310;
  ::fmt::v10::vformat_abi_cxx11_(&local_1038,local_870,fmt_04,args_04);
  Error::Error(&local_1018,kSecurity,&local_1038);
  Error::ToString_abi_cxx11_(&local_ff0,&local_1018);
  local_fd0 = std::__cxx11::string::find((char *)&local_ff0,0x33587c);
  local_1050 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_fc8,
             "(Error { ErrorCode::kSecurity, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"SECURITY\"))"
             ,"0U",&local_fd0,&local_1050);
  std::__cxx11::string::~string((string *)&local_ff0);
  Error::~Error(&local_1018);
  std::__cxx11::string::~string((string *)&local_1038);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fc8);
  if (!bVar1) {
    testing::Message::Message(&local_1058);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_fc8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1058);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fc8);
  TestBody::anon_class_1_0_00000001::operator()(&local_10f2);
  local_658 = &local_10f0;
  local_660 = &local_10f1;
  bVar3 = ::fmt::v10::operator()(local_660);
  local_10e8 = bVar3.size_;
  local_10f0 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_8b0 = local_10f0;
  sStack_8a8 = local_10e8;
  local_4e0 = &local_8b0;
  local_8c0 = local_10f0;
  local_8b8 = local_10e8;
  local_8a0 = &local_10e0;
  local_4d8 = local_8c0;
  sStack_4d0 = local_8b8;
  local_8e8[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_300 = local_8d0;
  local_308 = local_8e8;
  local_a8 = 0;
  args_05.field_1.values_ = in_R9.values_;
  args_05.desc_ = (unsigned_long_long)local_308;
  fmt_05.size_ = 0;
  fmt_05.data_ = (char *)local_8b8;
  local_1f0 = local_308;
  local_b0 = local_308;
  local_a0 = local_300;
  ::fmt::v10::vformat_abi_cxx11_(&local_10e0,local_8c0,fmt_05,args_05);
  Error::Error(&local_10c0,kUnimplemented,&local_10e0);
  Error::ToString_abi_cxx11_(&local_1098,&local_10c0);
  local_1078 = std::__cxx11::string::find((char *)&local_1098,0x335a1a);
  local_10f8 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_1070,
             "(Error { ErrorCode::kUnimplemented, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"UNIMPLEMENTED\"))"
             ,"0U",&local_1078,&local_10f8);
  std::__cxx11::string::~string((string *)&local_1098);
  Error::~Error(&local_10c0);
  std::__cxx11::string::~string((string *)&local_10e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1070);
  if (!bVar1) {
    testing::Message::Message(&local_1100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1070);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1070);
  TestBody::anon_class_1_0_00000001::operator()(&local_119a);
  local_648 = &local_1198;
  local_650 = &local_1199;
  bVar3 = ::fmt::v10::operator()(local_650);
  local_1190 = bVar3.size_;
  local_1198 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_900 = local_1198;
  sStack_8f8 = local_1190;
  local_4c0 = &local_900;
  local_910 = local_1198;
  local_908 = local_1190;
  local_8f0 = &local_1188;
  local_4b8 = local_910;
  sStack_4b0 = local_908;
  local_938[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_2f0 = local_920;
  local_2f8 = local_938;
  local_c0 = 0;
  args_06.field_1.values_ = in_R9.values_;
  args_06.desc_ = (unsigned_long_long)local_2f8;
  fmt_06.size_ = 0;
  fmt_06.data_ = (char *)local_908;
  local_1f8 = local_2f8;
  local_c8 = local_2f8;
  local_b8 = local_2f0;
  ::fmt::v10::vformat_abi_cxx11_(&local_1188,local_910,fmt_06,args_06);
  Error::Error(&local_1168,kBadFormat,&local_1188);
  Error::ToString_abi_cxx11_(&local_1140,&local_1168);
  local_1120 = std::__cxx11::string::find((char *)&local_1140,0x335bb6);
  local_11a0 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_1118,
             "(Error { ErrorCode::kBadFormat, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"BAD_FORMAT\"))"
             ,"0U",&local_1120,&local_11a0);
  std::__cxx11::string::~string((string *)&local_1140);
  Error::~Error(&local_1168);
  std::__cxx11::string::~string((string *)&local_1188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1118);
  if (!bVar1) {
    testing::Message::Message(&local_11a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_11a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_11a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1118);
  TestBody::anon_class_1_0_00000001::operator()(&local_1242);
  local_638 = &local_1240;
  local_640 = &local_1241;
  bVar3 = ::fmt::v10::operator()(local_640);
  local_1238 = bVar3.size_;
  local_1240 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_950 = local_1240;
  sStack_948 = local_1238;
  local_4a0 = &local_950;
  local_960 = local_1240;
  local_958 = local_1238;
  local_940 = &local_1230;
  local_498 = local_960;
  sStack_490 = local_958;
  local_988[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_2e0 = local_970;
  local_2e8 = local_988;
  local_d8 = 0;
  args_07.field_1.values_ = in_R9.values_;
  args_07.desc_ = (unsigned_long_long)local_2e8;
  fmt_07.size_ = 0;
  fmt_07.data_ = (char *)local_958;
  local_200 = local_2e8;
  local_e0 = local_2e8;
  local_d0 = local_2e0;
  ::fmt::v10::vformat_abi_cxx11_(&local_1230,local_960,fmt_07,args_07);
  Error::Error(&local_1210,kBusy,&local_1230);
  Error::ToString_abi_cxx11_(&local_11e8,&local_1210);
  local_11c8 = std::__cxx11::string::find((char *)&local_11e8,0x336203);
  local_1248 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_11c0,
             "(Error { ErrorCode::kBusy, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"BUSY\"))"
             ,"0U",&local_11c8,&local_1248);
  std::__cxx11::string::~string((string *)&local_11e8);
  Error::~Error(&local_1210);
  std::__cxx11::string::~string((string *)&local_1230);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11c0);
  if (!bVar1) {
    testing::Message::Message(&local_1250);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11c0);
  TestBody::anon_class_1_0_00000001::operator()(&local_12ea);
  local_628 = &local_12e8;
  local_630 = &local_12e9;
  bVar3 = ::fmt::v10::operator()(local_630);
  local_12e0 = bVar3.size_;
  local_12e8 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_9a0 = local_12e8;
  sStack_998 = local_12e0;
  local_480 = &local_9a0;
  local_9b0 = local_12e8;
  local_9a8 = local_12e0;
  local_990 = &local_12d8;
  local_478 = local_9b0;
  sStack_470 = local_9a8;
  local_9d8[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_2d0 = local_9c0;
  local_2d8 = local_9d8;
  local_f0 = 0;
  args_08.field_1.values_ = in_R9.values_;
  args_08.desc_ = (unsigned_long_long)local_2d8;
  fmt_08.size_ = 0;
  fmt_08.data_ = (char *)local_9a8;
  local_208 = local_2d8;
  local_f8 = local_2d8;
  local_e8 = local_2d0;
  ::fmt::v10::vformat_abi_cxx11_(&local_12d8,local_9b0,fmt_08,args_08);
  Error::Error(&local_12b8,kOutOfMemory,&local_12d8);
  Error::ToString_abi_cxx11_(&local_1290,&local_12b8);
  local_1270 = std::__cxx11::string::find((char *)&local_1290,0x335ed7);
  local_12f0 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_1268,
             "(Error { ErrorCode::kOutOfMemory, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"OUT_OF_MEMORY\"))"
             ,"0U",&local_1270,&local_12f0);
  std::__cxx11::string::~string((string *)&local_1290);
  Error::~Error(&local_12b8);
  std::__cxx11::string::~string((string *)&local_12d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1268);
  if (!bVar1) {
    testing::Message::Message(&local_12f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_12f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_12f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1268);
  TestBody::anon_class_1_0_00000001::operator()(&local_1392);
  local_618 = &local_1390;
  local_620 = &local_1391;
  bVar3 = ::fmt::v10::operator()(local_620);
  local_1388 = bVar3.size_;
  local_1390 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_9f0 = local_1390;
  sStack_9e8 = local_1388;
  local_460 = &local_9f0;
  local_a00 = local_1390;
  local_9f8 = local_1388;
  local_9e0 = &local_1380;
  local_458 = local_a00;
  sStack_450 = local_9f8;
  local_a28[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_2c0 = local_a10;
  local_2c8 = local_a28;
  local_108 = 0;
  args_09.field_1.values_ = in_R9.values_;
  args_09.desc_ = (unsigned_long_long)local_2c8;
  fmt_09.size_ = 0;
  fmt_09.data_ = (char *)local_9f8;
  local_210 = local_2c8;
  local_110 = local_2c8;
  local_100 = local_2c0;
  ::fmt::v10::vformat_abi_cxx11_(&local_1380,local_a00,fmt_09,args_09);
  Error::Error(&local_1360,kIOError,&local_1380);
  Error::ToString_abi_cxx11_(&local_1338,&local_1360);
  local_1318 = std::__cxx11::string::find((char *)&local_1338,0x33606f);
  local_1398 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_1310,
             "(Error { ErrorCode::kIOError, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"IO_ERROR\"))"
             ,"0U",&local_1318,&local_1398);
  std::__cxx11::string::~string((string *)&local_1338);
  Error::~Error(&local_1360);
  std::__cxx11::string::~string((string *)&local_1380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1310);
  if (!bVar1) {
    testing::Message::Message(&local_13a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_13a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_13a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1310);
  TestBody::anon_class_1_0_00000001::operator()(&local_143a);
  local_608 = &local_1438;
  local_610 = &local_1439;
  bVar3 = ::fmt::v10::operator()(local_610);
  local_1430 = bVar3.size_;
  local_1438 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_a40 = local_1438;
  sStack_a38 = local_1430;
  local_440 = &local_a40;
  local_a50 = local_1438;
  local_a48 = local_1430;
  local_a30 = &local_1428;
  local_438 = local_a50;
  sStack_430 = local_a48;
  local_a78[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_2b0 = local_a60;
  local_2b8 = local_a78;
  local_120 = 0;
  args_10.field_1.values_ = in_R9.values_;
  args_10.desc_ = (unsigned_long_long)local_2b8;
  fmt_10.size_ = 0;
  fmt_10.data_ = (char *)local_a48;
  local_218 = local_2b8;
  local_128 = local_2b8;
  local_118 = local_2b0;
  ::fmt::v10::vformat_abi_cxx11_(&local_1428,local_a50,fmt_10,args_10);
  Error::Error(&local_1408,kIOBusy,&local_1428);
  Error::ToString_abi_cxx11_(&local_13e0,&local_1408);
  local_13c0 = std::__cxx11::string::find((char *)&local_13e0,0x336200);
  local_1440 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_13b8,
             "(Error { ErrorCode::kIOBusy, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"IO_BUSY\"))"
             ,"0U",&local_13c0,&local_1440);
  std::__cxx11::string::~string((string *)&local_13e0);
  Error::~Error(&local_1408);
  std::__cxx11::string::~string((string *)&local_1428);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13b8);
  if (!bVar1) {
    testing::Message::Message(&local_1448);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_13b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_1448);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_1448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13b8);
  TestBody::anon_class_1_0_00000001::operator()(&local_14e2);
  local_5f8 = &local_14e0;
  local_600 = &local_14e1;
  bVar3 = ::fmt::v10::operator()(local_600);
  local_14d8 = bVar3.size_;
  local_14e0 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_a90 = local_14e0;
  sStack_a88 = local_14d8;
  local_420 = &local_a90;
  local_aa0 = local_14e0;
  local_a98 = local_14d8;
  local_a80 = &local_14d0;
  local_418 = local_aa0;
  sStack_410 = local_a98;
  local_ac8[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_2a0 = local_ab0;
  local_2a8 = local_ac8;
  local_138 = 0;
  args_11.field_1.values_ = in_R9.values_;
  args_11.desc_ = (unsigned_long_long)local_2a8;
  fmt_11.size_ = 0;
  fmt_11.data_ = (char *)local_a98;
  local_220 = local_2a8;
  local_140 = local_2a8;
  local_130 = local_2a0;
  ::fmt::v10::vformat_abi_cxx11_(&local_14d0,local_aa0,fmt_11,args_11);
  Error::Error(&local_14b0,kAlreadyExists,&local_14d0);
  Error::ToString_abi_cxx11_(&local_1488,&local_14b0);
  local_1468 = std::__cxx11::string::find((char *)&local_1488,0x33639e);
  local_14e8 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_1460,
             "(Error { ErrorCode::kAlreadyExists, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"ALREADY_EXISTS\"))"
             ,"0U",&local_1468,&local_14e8);
  std::__cxx11::string::~string((string *)&local_1488);
  Error::~Error(&local_14b0);
  std::__cxx11::string::~string((string *)&local_14d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1460);
  if (!bVar1) {
    testing::Message::Message(&local_14f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1460);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_14f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_14f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1460);
  TestBody::anon_class_1_0_00000001::operator()(&local_158a);
  local_5e8 = &local_1588;
  local_5f0 = &local_1589;
  bVar3 = ::fmt::v10::operator()(local_5f0);
  local_1580 = bVar3.size_;
  local_1588 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_ae0 = local_1588;
  sStack_ad8 = local_1580;
  local_400 = &local_ae0;
  local_af0 = local_1588;
  local_ae8 = local_1580;
  local_ad0 = &local_1578;
  local_3f8 = local_af0;
  sStack_3f0 = local_ae8;
  local_b18[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_290 = local_b00;
  local_298 = local_b18;
  local_150 = 0;
  args_12.field_1.values_ = in_R9.values_;
  args_12.desc_ = (unsigned_long_long)local_298;
  fmt_12.size_ = 0;
  fmt_12.data_ = (char *)local_ae8;
  local_228 = local_298;
  local_158 = local_298;
  local_148 = local_290;
  ::fmt::v10::vformat_abi_cxx11_(&local_1578,local_af0,fmt_12,args_12);
  Error::Error(&local_1558,kAborted,&local_1578);
  Error::ToString_abi_cxx11_(&local_1530,&local_1558);
  local_1510 = std::__cxx11::string::find((char *)&local_1530,0x336536);
  local_1590 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_1508,
             "(Error { ErrorCode::kAborted, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"ABORTED\"))"
             ,"0U",&local_1510,&local_1590);
  std::__cxx11::string::~string((string *)&local_1530);
  Error::~Error(&local_1558);
  std::__cxx11::string::~string((string *)&local_1578);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1508);
  if (!bVar1) {
    testing::Message::Message(&local_1598);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1508);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_1598);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_1598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1508);
  TestBody::anon_class_1_0_00000001::operator()(&local_1632);
  local_5d8 = &local_1630;
  local_5e0 = &local_1631;
  bVar3 = ::fmt::v10::operator()(local_5e0);
  local_1628 = bVar3.size_;
  local_1630 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_b30 = local_1630;
  sStack_b28 = local_1628;
  local_3e0 = &local_b30;
  local_b40 = local_1630;
  local_b38 = local_1628;
  local_b20 = &local_1620;
  local_3d8 = local_b40;
  sStack_3d0 = local_b38;
  local_b68[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_280 = local_b50;
  local_288 = local_b68;
  local_168 = 0;
  args_13.field_1.values_ = in_R9.values_;
  args_13.desc_ = (unsigned_long_long)local_288;
  fmt_13.size_ = 0;
  fmt_13.data_ = (char *)local_b38;
  local_230 = local_288;
  local_170 = local_288;
  local_160 = local_280;
  ::fmt::v10::vformat_abi_cxx11_(&local_1620,local_b40,fmt_13,args_13);
  Error::Error(&local_1600,kInvalidState,&local_1620);
  Error::ToString_abi_cxx11_(&local_15d8,&local_1600);
  local_15b8 = std::__cxx11::string::find((char *)&local_15d8,0x3366d2);
  local_1638 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_15b0,
             "(Error { ErrorCode::kInvalidState, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"INVALID_STATE\"))"
             ,"0U",&local_15b8,&local_1638);
  std::__cxx11::string::~string((string *)&local_15d8);
  Error::~Error(&local_1600);
  std::__cxx11::string::~string((string *)&local_1620);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15b0);
  if (!bVar1) {
    testing::Message::Message(&local_1640);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_15b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_1640);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_1640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15b0);
  TestBody::anon_class_1_0_00000001::operator()(&local_16da);
  local_5c8 = &local_16d8;
  local_5d0 = &local_16d9;
  bVar3 = ::fmt::v10::operator()(local_5d0);
  local_16d0 = bVar3.size_;
  local_16d8 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_b80 = local_16d8;
  sStack_b78 = local_16d0;
  local_3c0 = &local_b80;
  local_b90 = local_16d8;
  local_b88 = local_16d0;
  local_b70 = &local_16c8;
  local_3b8 = local_b90;
  sStack_3b0 = local_b88;
  local_bb8[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_270 = local_ba0;
  local_278 = local_bb8;
  local_180 = 0;
  args_14.field_1.values_ = in_R9.values_;
  args_14.desc_ = (unsigned_long_long)local_278;
  fmt_14.size_ = 0;
  fmt_14.data_ = (char *)local_b88;
  local_238 = local_278;
  local_188 = local_278;
  local_178 = local_270;
  ::fmt::v10::vformat_abi_cxx11_(&local_16c8,local_b90,fmt_14,args_14);
  Error::Error(&local_16a8,kRejected,&local_16c8);
  Error::ToString_abi_cxx11_(&local_1680,&local_16a8);
  local_1660 = std::__cxx11::string::find((char *)&local_1680,0x33686b);
  local_16e0 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_1658,
             "(Error { ErrorCode::kRejected, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"REJECTED\"))"
             ,"0U",&local_1660,&local_16e0);
  std::__cxx11::string::~string((string *)&local_1680);
  Error::~Error(&local_16a8);
  std::__cxx11::string::~string((string *)&local_16c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1658);
  if (!bVar1) {
    testing::Message::Message(&local_16e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1658);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_16e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_16e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1658);
  TestBody::anon_class_1_0_00000001::operator()(&local_1782);
  local_5b8 = &local_1780;
  local_5c0 = &local_1781;
  bVar3 = ::fmt::v10::operator()(local_5c0);
  local_1778 = bVar3.size_;
  local_1780 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_bd0 = local_1780;
  sStack_bc8 = local_1778;
  local_3a0 = &local_bd0;
  local_be0 = local_1780;
  local_bd8 = local_1778;
  local_bc0 = &local_1770;
  local_398 = local_be0;
  sStack_390 = local_bd8;
  local_c08[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_260 = local_bf0;
  local_268 = local_c08;
  local_198 = 0;
  args_15.field_1.values_ = in_R9.values_;
  args_15.desc_ = (unsigned_long_long)local_268;
  fmt_15.size_ = 0;
  fmt_15.data_ = (char *)local_bd8;
  local_240 = local_268;
  local_1a0 = local_268;
  local_190 = local_260;
  ::fmt::v10::vformat_abi_cxx11_(&local_1770,local_be0,fmt_15,args_15);
  Error::Error(&local_1750,kCoapError,&local_1770);
  Error::ToString_abi_cxx11_(&local_1728,&local_1750);
  local_1708 = std::__cxx11::string::find((char *)&local_1728,0x336a02);
  local_1788 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_1700,
             "(Error { ErrorCode::kCoapError, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"COAP_ERROR\"))"
             ,"0U",&local_1708,&local_1788);
  std::__cxx11::string::~string((string *)&local_1728);
  Error::~Error(&local_1750);
  std::__cxx11::string::~string((string *)&local_1770);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1700);
  if (!bVar1) {
    testing::Message::Message(&local_1790);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1700);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_1790);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_1790);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1700);
  TestBody::anon_class_1_0_00000001::operator()(&local_182a);
  local_5a8 = &local_1828;
  local_5b0 = &local_1829;
  bVar3 = ::fmt::v10::operator()(local_5b0);
  local_1820 = bVar3.size_;
  local_1828 = (v10 *)bVar3.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_c20 = local_1828;
  sStack_c18 = local_1820;
  local_380 = &local_c20;
  local_c30 = local_1828;
  local_c28 = local_1820;
  local_c10 = &local_1818;
  local_378 = local_c30;
  sStack_370 = local_c28;
  this_local = (ErrorTest_ErrorToString_NonOkErrorToString_Test *)
               ::fmt::v10::make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                         ();
  local_250 = local_c40;
  local_258 = &this_local;
  local_1b0 = 0;
  args_16.field_1.values_ = in_R9.values_;
  args_16.desc_ = (unsigned_long_long)local_258;
  fmt_16.size_ = 0;
  fmt_16.data_ = (char *)local_c28;
  local_248 = local_258;
  local_1b8 = local_258;
  local_1a8 = local_250;
  ::fmt::v10::vformat_abi_cxx11_(&local_1818,local_c30,fmt_16,args_16);
  Error::Error(&local_17f8,kUnknown,&local_1818);
  Error::ToString_abi_cxx11_(&local_17d0,&local_17f8);
  local_17b0 = std::__cxx11::string::find((char *)&local_17d0,0x344eea);
  local_1830 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_17a8,
             "(Error { ErrorCode::kUnknown, fmt::format([] { struct __attribute__((visibility(\"hidden\"))) FMT_COMPILE_STRING : fmt::detail::compile_string { using char_type = fmt::remove_cvref_t<decltype((\"\")[0])>; operator fmt::basic_string_view<char_type>() const { return fmt::detail_exported::compile_string_to_view<char_type>((\"\")); } }; return FMT_COMPILE_STRING(); }()) }.ToString().find(\"UNKNOWN\"))"
             ,"0U",&local_17b0,&local_1830);
  std::__cxx11::string::~string((string *)&local_17d0);
  Error::~Error(&local_17f8);
  std::__cxx11::string::~string((string *)&local_1818);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17a8);
  if (!bVar1) {
    testing::Message::Message(&local_1838);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_17a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1840,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1840,&local_1838);
    testing::internal::AssertHelper::~AssertHelper(&local_1840);
    testing::Message::~Message(&local_1838);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17a8);
  return;
}

Assistant:

TEST(ErrorTest, ErrorToString_NonOkErrorToString)
{
// Check if the error string starts with the error name.
#define CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(aErrorName) \
    EXPECT_EQ((ERROR_##aErrorName("").ToString().find(#aErrorName)), 0U)

    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(CANCELLED);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(INVALID_ARGS);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(INVALID_COMMAND);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(TIMEOUT);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(NOT_FOUND);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(SECURITY);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(UNIMPLEMENTED);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(BAD_FORMAT);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(BUSY);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(OUT_OF_MEMORY);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(IO_ERROR);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(IO_BUSY);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(ALREADY_EXISTS);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(ABORTED);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(INVALID_STATE);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(REJECTED);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(COAP_ERROR);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(UNKNOWN);

#undef CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME
}